

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::PolygonNumSamplesCase::renderPattern(PolygonNumSamplesCase *this)

{
  int i;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec2 local_58;
  Vec2 local_50;
  Vec2 local_48;
  Vector<float,_4> local_40;
  
  for (iVar1 = 0; iVar1 != 0x19; iVar1 = iVar1 + 1) {
    fVar2 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001;
    fVar4 = ((float)iVar1 * 6.2831855) / 25.0 + fVar2;
    fVar2 = (((float)iVar1 + 0.5) * 6.2831855) / 25.0 + fVar2;
    local_48.m_data[0] = 0.0;
    local_48.m_data[1] = 0.0;
    fVar3 = cosf(fVar4);
    fVar4 = sinf(fVar4);
    local_50.m_data[1] = fVar4 * (float)0x3f733333;
    local_50.m_data[0] = fVar3 * (float)0x3f733333;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    local_58.m_data[1] = fVar2 * (float)0x3f733333;
    local_58.m_data[0] = fVar3 * (float)0x3f733333;
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    MultisampleCase::renderTriangle((MultisampleCase *)this,&local_48,&local_50,&local_58,&local_40)
    ;
  }
  return;
}

Assistant:

void PolygonNumSamplesCase::renderPattern (void) const
{
	// The test pattern consists of several triangles with edges at different angles.

	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles + 0.001f*(float)m_currentIteration;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles + 0.001f*(float)m_currentIteration;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(1.0f));
	}
}